

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::CFIReaderImpl::~CFIReaderImpl(CFIReaderImpl *this)

{
  pointer pcVar1;
  uchar *puVar2;
  
  (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
       (_func_int **)&PTR__CFIReaderImpl_008e5cb8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>_>_>
  ::~_Rb_tree(&(this->vocabularyMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
  ::~_Rb_tree(&(this->decoderMap)._M_t);
  pcVar1 = (this->nodeName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->nodeName).field_2) {
    operator_delete(pcVar1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->elementStack).c);
  std::vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
  ~vector(&this->attributes);
  std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>::~vector
            (&(this->vocabulary).attributeNameTable);
  std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>::~vector
            (&(this->vocabulary).elementNameTable);
  std::
  vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
  ::~vector(&(this->vocabulary).otherStringTable);
  std::
  vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
  ::~vector(&(this->vocabulary).charactersTable);
  std::
  vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
  ::~vector(&(this->vocabulary).attributeValueTable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->vocabulary).otherURITable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->vocabulary).otherNCNameTable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->vocabulary).localNameTable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->vocabulary).namespaceNameTable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->vocabulary).prefixTable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->vocabulary).encodingAlgorithmTable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->vocabulary).restrictedAlphabetTable);
  puVar2 = (this->data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar2 != (uchar *)0x0) {
    operator_delete__(puVar2);
  }
  (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  return;
}

Assistant:

virtual bool read() /*override*/ {
        if (headerPending) {
            headerPending = false;
            parseHeader();
        }
        if (terminatorPending) {
            terminatorPending = false;
            if (elementStack.empty()) {
                return false;
            }
            else {
                nodeName = elementStack.top();
                elementStack.pop();
                currentNodeType = nodeName.empty() ? irr::io::EXN_UNKNOWN : irr::io::EXN_ELEMENT_END;
                return true;
            }
        }
        if (dataP >= dataEnd) {
            return false;
        }
        uint8_t b = *dataP;
        if (b < 0x80) { // Element (C.2.11.2, C.3.7.2)
            // C.3
            parseElement();
            return true;
        }
        else if (b < 0xc0) { // Characters (C.3.7.5)
            // C.7
            auto chars = parseNonIdentifyingStringOrIndex3(vocabulary.charactersTable);
            nodeName = chars->toString();
            currentNodeType = irr::io::EXN_TEXT;
            return true;
        }
        else if (b < 0xe0) {
            if ((b & 0xfc) == 0xc4) { // DTD (C.2.11.5)
                // C.9
                ++dataP;
                if (b & 0x02) {
                    /*const std::string &systemID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                if (b & 0x01) {
                    /*const std::string &publicID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                elementStack.push(EmptyString);
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
            else if ((b & 0xfc) == 0xc8) { // Unexpanded entity reference (C.3.7.4)
                // C.6
                ++dataP;
                /*const std::string &name =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                if (b & 0x02) {
                    /*const std::string &systemID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                if (b & 0x01) {
                    /*const std::string &publicID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
        }
        else if (b < 0xf0) {
            if (b == 0xe1) { // Processing instruction (C.2.11.3, C.3.7.3)
                // C.5
                ++dataP;
                /*const std::string &target =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /*std::shared_ptr<const FIValue> data =*/ parseNonIdentifyingStringOrIndex1(vocabulary.otherStringTable);
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
            else if (b == 0xe2) { // Comment (C.2.11.4, C.3.7.6)
                // C.8
                ++dataP;
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                std::shared_ptr<const FIValue> comment = parseNonIdentifyingStringOrIndex1(vocabulary.otherStringTable);
                nodeName = comment->toString();
                currentNodeType = irr::io::EXN_COMMENT;
                return true;
            }
        }
        else { // Terminator (C.2.12, C.3.8)
            ++dataP;
            if (b == 0xff) {
                terminatorPending = true;
            }
            if (elementStack.empty()) {
                return false;
            }
            else {
                nodeName = elementStack.top();
                elementStack.pop();
                currentNodeType = nodeName.empty() ? irr::io::EXN_UNKNOWN : irr::io::EXN_ELEMENT_END;
                return true;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }